

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O1

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  float fVar5;
  Mat local_98;
  Mat local_58;
  
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.elemsize = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.data = (void *)0x0;
  local_58.refcount = (int *)0x0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,0,&local_58);
  if (&this->min_sizes != &local_98) {
    if (local_98.refcount != (int *)0x0) {
      LOCK();
      *local_98.refcount = *local_98.refcount + 1;
      UNLOCK();
    }
    piVar1 = (this->min_sizes).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->min_sizes).data;
        pAVar3 = (this->min_sizes).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(*(void **)((long)pvVar2 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->min_sizes).data = (void *)0x0;
    (this->min_sizes).refcount = (int *)0x0;
    (this->min_sizes).elemsize = 0;
    (this->min_sizes).cstep = 0;
    (this->min_sizes).dims = 0;
    (this->min_sizes).w = 0;
    (this->min_sizes).h = 0;
    (this->min_sizes).c = 0;
    (this->min_sizes).data = local_98.data;
    (this->min_sizes).refcount = local_98.refcount;
    (this->min_sizes).elemsize = local_98.elemsize;
    (this->min_sizes).allocator = local_98.allocator;
    (this->min_sizes).dims = local_98.dims;
    (this->min_sizes).w = local_98.w;
    (this->min_sizes).h = local_98.h;
    (this->min_sizes).c = local_98.c;
    (this->min_sizes).cstep = local_98.cstep;
  }
  if (local_98.refcount != (int *)0x0) {
    LOCK();
    *local_98.refcount = *local_98.refcount + -1;
    UNLOCK();
    if (*local_98.refcount == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(*(void **)((long)local_98.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 8))();
      }
    }
  }
  local_98.data = (void *)0x0;
  local_98.refcount = (int *)0x0;
  local_98.elemsize = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  if (local_58.refcount != (int *)0x0) {
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(*(void **)((long)local_58.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 8))();
      }
    }
  }
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.elemsize = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.data = (void *)0x0;
  local_58.refcount = (int *)0x0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,1,&local_58);
  if (&this->max_sizes != &local_98) {
    if (local_98.refcount != (int *)0x0) {
      LOCK();
      *local_98.refcount = *local_98.refcount + 1;
      UNLOCK();
    }
    piVar1 = (this->max_sizes).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->max_sizes).data;
        pAVar3 = (this->max_sizes).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(*(void **)((long)pvVar2 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->max_sizes).data = (void *)0x0;
    (this->max_sizes).refcount = (int *)0x0;
    (this->max_sizes).elemsize = 0;
    (this->max_sizes).cstep = 0;
    (this->max_sizes).dims = 0;
    (this->max_sizes).w = 0;
    (this->max_sizes).h = 0;
    (this->max_sizes).c = 0;
    (this->max_sizes).data = local_98.data;
    (this->max_sizes).refcount = local_98.refcount;
    (this->max_sizes).elemsize = local_98.elemsize;
    (this->max_sizes).allocator = local_98.allocator;
    (this->max_sizes).dims = local_98.dims;
    (this->max_sizes).w = local_98.w;
    (this->max_sizes).h = local_98.h;
    (this->max_sizes).c = local_98.c;
    (this->max_sizes).cstep = local_98.cstep;
  }
  if (local_98.refcount != (int *)0x0) {
    LOCK();
    *local_98.refcount = *local_98.refcount + -1;
    UNLOCK();
    if (*local_98.refcount == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(*(void **)((long)local_98.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 8))();
      }
    }
  }
  local_98.data = (void *)0x0;
  local_98.refcount = (int *)0x0;
  local_98.elemsize = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  if (local_58.refcount != (int *)0x0) {
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(*(void **)((long)local_58.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 8))();
      }
    }
  }
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.elemsize = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.data = (void *)0x0;
  local_58.refcount = (int *)0x0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,2,&local_58);
  if (&this->aspect_ratios != &local_98) {
    if (local_98.refcount != (int *)0x0) {
      LOCK();
      *local_98.refcount = *local_98.refcount + 1;
      UNLOCK();
    }
    piVar1 = (this->aspect_ratios).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->aspect_ratios).data;
        pAVar3 = (this->aspect_ratios).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(*(void **)((long)pvVar2 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->aspect_ratios).data = (void *)0x0;
    (this->aspect_ratios).refcount = (int *)0x0;
    (this->aspect_ratios).elemsize = 0;
    (this->aspect_ratios).cstep = 0;
    (this->aspect_ratios).dims = 0;
    (this->aspect_ratios).w = 0;
    (this->aspect_ratios).h = 0;
    (this->aspect_ratios).c = 0;
    (this->aspect_ratios).data = local_98.data;
    (this->aspect_ratios).refcount = local_98.refcount;
    (this->aspect_ratios).elemsize = local_98.elemsize;
    (this->aspect_ratios).allocator = local_98.allocator;
    (this->aspect_ratios).dims = local_98.dims;
    (this->aspect_ratios).w = local_98.w;
    (this->aspect_ratios).h = local_98.h;
    (this->aspect_ratios).c = local_98.c;
    (this->aspect_ratios).cstep = local_98.cstep;
  }
  if (local_98.refcount != (int *)0x0) {
    LOCK();
    *local_98.refcount = *local_98.refcount + -1;
    UNLOCK();
    if (*local_98.refcount == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(*(void **)((long)local_98.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 8))();
      }
    }
  }
  local_98.data = (void *)0x0;
  local_98.refcount = (int *)0x0;
  local_98.elemsize = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  if (local_58.refcount != (int *)0x0) {
    LOCK();
    *local_58.refcount = *local_58.refcount + -1;
    UNLOCK();
    if (*local_58.refcount == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(*(void **)((long)local_58.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 8))();
      }
    }
  }
  fVar5 = ParamDict::get(pd,3,0.0);
  this->variances[0] = fVar5;
  fVar5 = ParamDict::get(pd,4,0.0);
  this->variances[1] = fVar5;
  fVar5 = ParamDict::get(pd,5,0.0);
  this->variances[2] = fVar5;
  fVar5 = ParamDict::get(pd,6,0.0);
  this->variances[3] = fVar5;
  iVar4 = ParamDict::get(pd,7,1);
  this->flip = iVar4;
  iVar4 = ParamDict::get(pd,8,0);
  this->clip = iVar4;
  iVar4 = ParamDict::get(pd,9,0);
  this->image_width = iVar4;
  iVar4 = ParamDict::get(pd,10,0);
  this->image_height = iVar4;
  fVar5 = ParamDict::get(pd,0xb,-233.0);
  this->step_width = fVar5;
  fVar5 = ParamDict::get(pd,0xc,-233.0);
  this->step_height = fVar5;
  fVar5 = ParamDict::get(pd,0xd,0.0);
  this->offset = fVar5;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.f);
    variances[1] = pd.get(4, 0.f);
    variances[2] = pd.get(5, 0.f);
    variances[3] = pd.get(6, 0.f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);

    return 0;
}